

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O2

bool __thiscall sglr::rc::Texture3D::isComplete(Texture3D *this)

{
  ChannelType *pCVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  TextureFormat *format;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  size_t *psVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  uVar2 = (this->super_Texture).m_baseLevel;
  uVar8 = (ulong)uVar2;
  if (0xd < uVar8) {
    return false;
  }
  if ((this->m_levels).m_data[uVar8].m_cap == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
      uVar3 = (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[1];
      uVar4 = (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[2];
      iVar14 = ((this->super_Texture).m_maxLevel - uVar2) + 1;
      uVar10 = uVar4;
      if ((int)uVar4 < (int)uVar3) {
        uVar10 = uVar3;
      }
      uVar5 = (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_size.m_data[0];
      if ((int)uVar10 < (int)uVar5) {
        uVar10 = uVar5;
      }
      uVar12 = 0x20;
      if (uVar10 != 0) {
        uVar12 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = uVar12 ^ 0x1f;
      }
      iVar15 = 0x20 - uVar12;
      if (iVar14 < (int)(0x20 - uVar12)) {
        iVar15 = iVar14;
      }
      psVar13 = &(this->m_levels).m_data[uVar8 + 1].m_cap;
      uVar9 = 1;
      piVar11 = (this->m_levels).m_access[uVar8 + 1].super_ConstPixelBufferAccess.m_size.m_data + 2;
      while (((bVar6 = (long)iVar15 <= (long)uVar9, (long)uVar9 < (long)iVar15 &&
              (0xe - uVar2 != uVar9)) && (*psVar13 != 0))) {
        bVar7 = (byte)uVar9;
        iVar14 = (int)uVar5 >> (bVar7 & 0x1f);
        if (iVar14 < 2) {
          iVar14 = 1;
        }
        iVar16 = (int)uVar4 >> (bVar7 & 0x1f);
        if (iVar16 < 2) {
          iVar16 = 1;
        }
        if (((IVec3 *)(piVar11 + -2))->m_data[0] != iVar14) {
          return bVar6;
        }
        iVar14 = (int)uVar3 >> (bVar7 & 0x1f);
        if (iVar14 < 2) {
          iVar14 = 1;
        }
        if (piVar11[-1] != iVar14) {
          return bVar6;
        }
        if (*piVar11 != iVar16) {
          return bVar6;
        }
        if (piVar11[-4] !=
            (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_format.order) {
          return bVar6;
        }
        uVar9 = uVar9 + 1;
        psVar13 = psVar13 + 2;
        pCVar1 = (ChannelType *)(piVar11 + -3);
        piVar11 = piVar11 + 10;
        if (*pCVar1 != (this->m_levels).m_access[uVar8].super_ConstPixelBufferAccess.m_format.type)
        {
          return bVar6;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

int							getBaseLevel	(void) const	{ return m_baseLevel;		}